

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_equal.c
# Opt level: O2

_Bool array_container_equal_bitset(array_container_t *container1,bitset_container_t *container2)

{
  long lVar1;
  int32_t i;
  long lVar2;
  long lVar3;
  uint64_t uVar4;
  
  if ((container2->cardinality != -1) && (container2->cardinality != container1->cardinality)) {
    return false;
  }
  lVar2 = 0;
  lVar3 = 0;
  do {
    if (lVar2 == 0x400) {
      return (int)lVar3 == container1->cardinality;
    }
    lVar3 = (long)(int)lVar3;
    for (uVar4 = container2->words[lVar2]; uVar4 != 0; uVar4 = uVar4 & uVar4 - 1) {
      if (container1->cardinality <= lVar3) {
        return false;
      }
      lVar1 = 0;
      if (uVar4 != 0) {
        for (; (uVar4 >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
        }
      }
      if (container1->array[lVar3] != (uint16_t)((ushort)lVar1 | (ushort)((int)lVar2 << 6))) {
        return false;
      }
      lVar3 = lVar3 + 1;
    }
    lVar2 = lVar2 + 1;
  } while( true );
}

Assistant:

bool array_container_equal_bitset(const array_container_t* container1,
                                  const bitset_container_t* container2) {
    if (container2->cardinality != BITSET_UNKNOWN_CARDINALITY) {
        if (container2->cardinality != container1->cardinality) {
            return false;
        }
    }
    int32_t pos = 0;
    for (int32_t i = 0; i < BITSET_CONTAINER_SIZE_IN_WORDS; ++i) {
        uint64_t w = container2->words[i];
        while (w != 0) {
            uint64_t t = w & (~w + 1);
            uint16_t r = i * 64 + roaring_trailing_zeroes(w);
            if (pos >= container1->cardinality) {
                return false;
            }
            if (container1->array[pos] != r) {
                return false;
            }
            ++pos;
            w ^= t;
        }
    }
    return (pos == container1->cardinality);
}